

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall Logger::writeLog(Logger *this,LogLevel level,string *date,string *message)

{
  char cVar1;
  ostream *poVar2;
  
  needCreateNewLogFile(this);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->logfp,"[",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->logfp,(date->_M_dataplus)._M_p,date->_M_string_length);
    if ((int)level < 6) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] [",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,LogLevelNames_abi_cxx11_[level]._M_dataplus._M_p,
                          LogLevelNames_abi_cxx11_[level]._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  if (this->outputToTerminal == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(date->_M_dataplus)._M_p,date->_M_string_length);
    if ((int)level < 6) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] [",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,LogLevelColors_abi_cxx11_[level]._M_dataplus._M_p,
                          LogLevelColors_abi_cxx11_[level]._M_string_length);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,LogLevelNames_abi_cxx11_[level]._M_dataplus._M_p,
                          LogLevelNames_abi_cxx11_[level]._M_string_length);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,LogLevelReset_abi_cxx11_._M_dataplus._M_p,
                          LogLevelReset_abi_cxx11_._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

inline void writeLog(LogLevel level, const std::string date, const std::string& message)  // 写入日志
    {
        needCreateNewLogFile();
#if defined(_WIN32) || defined(_WIN64)
        if (logFileHandle!= INVALID_HANDLE_VALUE) {      // 输出到文件
            if(level < LV_CLOSE) {
                std::string logMessage = "[" + date + "] [" + LogLevelNames[level] + "] " + message + "\r\n";
                DWORD bytesWritten = 0;
                WriteFile(logFileHandle, logMessage.c_str(), logMessage.length(), &bytesWritten, NULL);  
            }
        }
        if (outputToTerminal) {     // 输出到终端
            if(level < LV_CLOSE) std::cout << "[" << date << "] [" << LogLevelNames[level] << "] " << message << std::endl;
            else std::cout << "[" << date << "] " << message << std::endl;
        }
#else
        if (logfp.is_open()) {      // 输出到文件
            if(level < LV_CLOSE) logfp << "[" << date << "] [" << LogLevelNames[level] << "] " << message << std::endl;
            else logfp << "[" << date << "] " << message << std::endl;
            logfp.flush();
        }
        if (outputToTerminal) {     // 输出到终端
            if(level < LV_CLOSE) std::cout << "[" << date << "] [" << LogLevelColors[level] << LogLevelNames[level] << LogLevelReset << "] " << message << std::endl;
            else std::cout << "[" << date << "] " << message << std::endl;
        }
#endif 
    }